

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Replace>::moveAppend
          (QGenericArrayOps<Replace> *this,Replace *b,Replace *e)

{
  qsizetype *pqVar1;
  Replace *pRVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pRVar2 = (this->super_QArrayDataPointer<Replace>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<Replace>).size;
      pDVar4 = (b->in).d.d;
      (b->in).d.d = (Data *)0x0;
      pRVar2[lVar3].in.d.d = pDVar4;
      pcVar5 = (b->in).d.ptr;
      (b->in).d.ptr = (char16_t *)0x0;
      pRVar2[lVar3].in.d.ptr = pcVar5;
      qVar6 = (b->in).d.size;
      (b->in).d.size = 0;
      pRVar2[lVar3].in.d.size = qVar6;
      pDVar4 = (b->out).d.d;
      (b->out).d.d = (Data *)0x0;
      pRVar2[lVar3].out.d.d = pDVar4;
      pcVar5 = (b->out).d.ptr;
      (b->out).d.ptr = (char16_t *)0x0;
      pRVar2[lVar3].out.d.ptr = pcVar5;
      qVar6 = (b->out).d.size;
      (b->out).d.size = 0;
      pRVar2[lVar3].out.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<Replace>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }